

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_tree.hh
# Opt level: O0

void __thiscall
kp::tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>::~tree
          (tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_> *this)

{
  tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_> *this_local;
  
  clear(this);
  __gnu_cxx::new_allocator<kp::tree_node_<htmlcxx2::HTML::Node>>::
  destroy<kp::tree_node_<htmlcxx2::HTML::Node>>
            ((new_allocator<kp::tree_node_<htmlcxx2::HTML::Node>> *)&this->field_0x10,this->head);
  __gnu_cxx::new_allocator<kp::tree_node_<htmlcxx2::HTML::Node>>::
  destroy<kp::tree_node_<htmlcxx2::HTML::Node>>
            ((new_allocator<kp::tree_node_<htmlcxx2::HTML::Node>> *)&this->field_0x10,this->feet);
  __gnu_cxx::new_allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>::deallocate
            ((new_allocator<kp::tree_node_<htmlcxx2::HTML::Node>_> *)&this->field_0x10,this->head,1)
  ;
  __gnu_cxx::new_allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>::deallocate
            ((new_allocator<kp::tree_node_<htmlcxx2::HTML::Node>_> *)&this->field_0x10,this->feet,1)
  ;
  std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>::~allocator
            ((allocator<kp::tree_node_<htmlcxx2::HTML::Node>_> *)&this->field_0x10);
  return;
}

Assistant:

tree<T, tree_node_allocator>::~tree()
    {
    clear();
    alloc_.destroy(head);
    alloc_.destroy(feet);
    alloc_.deallocate(head,1);
    alloc_.deallocate(feet,1);
    }